

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O1

void __thiscall Connection::fill_fd_set(Connection *this,fd_set *rdfds,fd_set *wrfds)

{
  int iVar1;
  int iVar2;
  
  if (this->data_c_f_ == 0) {
    iVar1 = this->client_socket_;
    iVar2 = iVar1 + 0x3f;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    rdfds->fds_bits[iVar2 >> 6] = rdfds->fds_bits[iVar2 >> 6] | 1L << ((byte)iVar1 & 0x3f);
  }
  if (this->data_f_c_ == 0) {
    iVar1 = this->forwarding_socket_;
    iVar2 = iVar1 + 0x3f;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    rdfds->fds_bits[iVar2 >> 6] = rdfds->fds_bits[iVar2 >> 6] | 1L << ((byte)iVar1 & 0x3f);
  }
  if (0 < this->data_c_f_) {
    iVar1 = this->forwarding_socket_;
    iVar2 = iVar1 + 0x3f;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    wrfds->fds_bits[iVar2 >> 6] = wrfds->fds_bits[iVar2 >> 6] | 1L << ((byte)iVar1 & 0x3f);
  }
  if (0 < this->data_f_c_) {
    iVar1 = this->client_socket_;
    iVar2 = iVar1 + 0x3f;
    if (-1 < iVar1) {
      iVar2 = iVar1;
    }
    wrfds->fds_bits[iVar2 >> 6] = wrfds->fds_bits[iVar2 >> 6] | 1L << ((byte)iVar1 & 0x3f);
  }
  return;
}

Assistant:

void Connection::fill_fd_set(fd_set &rdfds, fd_set &wrfds) {
    if (data_c_f_ == 0) {
        FD_SET(client_socket_, &rdfds);
    }
    if (data_f_c_ == 0) {
        FD_SET(forwarding_socket_, &rdfds);
    }
    if (data_c_f_ > 0) {
        FD_SET(forwarding_socket_, &wrfds);
    }
    if (data_f_c_ > 0) {
        FD_SET(client_socket_, &wrfds);
    }
}